

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  int iVar3;
  undefined1 auVar4 [32];
  uint uVar5;
  long lVar6;
  undefined1 (*pauVar7) [32];
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  float fVar16;
  undefined1 auVar17 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar6 = 0;
    auVar12._8_4_ = 0x3f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar12._16_4_ = 0x3f800000;
    auVar12._20_4_ = 0x3f800000;
    auVar12._24_4_ = 0x3f800000;
    auVar12._28_4_ = 0x3f800000;
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    do {
      pauVar7 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar5 < 8) {
        uVar9 = 0;
      }
      else {
        iVar8 = 7;
        do {
          fVar1 = (this->super_HardSwish).beta;
          auVar2 = *pauVar7;
          fVar16 = (this->super_HardSwish).alpha;
          auVar15._0_4_ = fVar16 * auVar2._0_4_ + fVar1;
          auVar15._4_4_ = fVar16 * auVar2._4_4_ + fVar1;
          auVar15._8_4_ = fVar16 * auVar2._8_4_ + fVar1;
          auVar15._12_4_ = fVar16 * auVar2._12_4_ + fVar1;
          auVar15._16_4_ = fVar16 * auVar2._16_4_ + fVar1;
          auVar15._20_4_ = fVar16 * auVar2._20_4_ + fVar1;
          auVar15._24_4_ = fVar16 * auVar2._24_4_ + fVar1;
          auVar15._28_4_ = fVar16 + fVar1;
          auVar15 = vmaxps_avx(auVar15,ZEXT1632(ZEXT816(0) << 0x40));
          auVar15 = vminps_avx(auVar15,auVar12);
          auVar4._4_4_ = auVar15._4_4_ * auVar2._4_4_;
          auVar4._0_4_ = auVar15._0_4_ * auVar2._0_4_;
          auVar4._8_4_ = auVar15._8_4_ * auVar2._8_4_;
          auVar4._12_4_ = auVar15._12_4_ * auVar2._12_4_;
          auVar4._16_4_ = auVar15._16_4_ * auVar2._16_4_;
          auVar4._20_4_ = auVar15._20_4_ * auVar2._20_4_;
          auVar4._24_4_ = auVar15._24_4_ * auVar2._24_4_;
          auVar4._28_4_ = auVar15._28_4_;
          *pauVar7 = auVar4;
          pauVar7 = pauVar7 + 1;
          iVar8 = iVar8 + 8;
          uVar9 = uVar5 & 0xfffffff8;
        } while (iVar8 < (int)uVar5);
      }
      uVar11 = uVar9 | 3;
      while ((int)uVar11 < (int)uVar5) {
        fVar1 = (this->super_HardSwish).beta;
        fVar16 = (this->super_HardSwish).alpha;
        auVar17._0_4_ = fVar16 * *(float *)*pauVar7 + fVar1;
        auVar17._4_4_ = fVar16 * *(float *)(*pauVar7 + 4) + fVar1;
        auVar17._8_4_ = fVar16 * *(float *)(*pauVar7 + 8) + fVar1;
        auVar17._12_4_ = fVar16 * *(float *)(*pauVar7 + 0xc) + fVar1;
        auVar17 = vmaxps_avx(auVar17,ZEXT816(0) << 0x40);
        auVar17 = vminps_avx(auVar17,auVar13);
        auVar14._0_4_ = auVar17._0_4_ * *(float *)*pauVar7;
        auVar14._4_4_ = auVar17._4_4_ * *(float *)(*pauVar7 + 4);
        auVar14._8_4_ = auVar17._8_4_ * *(float *)(*pauVar7 + 8);
        auVar14._12_4_ = auVar17._12_4_ * *(float *)(*pauVar7 + 0xc);
        *(undefined1 (*) [16])*pauVar7 = auVar14;
        pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
        uVar11 = uVar9 + 7;
        uVar9 = uVar9 + 4;
      }
      if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
        lVar10 = 0;
        do {
          fVar1 = *(float *)(*pauVar7 + lVar10 * 4);
          fVar16 = 0.0;
          if (fVar1 < (this->super_HardSwish).lower) {
LAB_004718d5:
            *(float *)(*pauVar7 + lVar10 * 4) = fVar16;
          }
          else if (fVar1 <= (this->super_HardSwish).upper) {
            fVar16 = (fVar1 * (this->super_HardSwish).alpha + (this->super_HardSwish).beta) * fVar1;
            goto LAB_004718d5;
          }
          lVar10 = lVar10 + 1;
        } while (uVar5 - uVar9 != (int)lVar10);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar3);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}